

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
* __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
equal_range<google::protobuf::internal::(anonymous_namespace)::CustomStringView>
          (pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::iterator>
           *__return_storage_ptr__,
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
          *this,key_arg<google::protobuf::internal::(anonymous_namespace)::CustomStringView> *key)

{
  iterator it;
  UntypedMapIterator local_28;
  
  find<google::protobuf::internal::(anonymous_namespace)::CustomStringView>
            ((iterator *)&local_28,this,key);
  (__return_storage_ptr__->first).super_UntypedMapIterator.bucket_index_ = local_28.bucket_index_;
  *(undefined4 *)&(__return_storage_ptr__->first).super_UntypedMapIterator.field_0x14 =
       local_28._20_4_;
  (__return_storage_ptr__->first).super_UntypedMapIterator.node_ = local_28.node_;
  (__return_storage_ptr__->first).super_UntypedMapIterator.m_ = local_28.m_;
  if (local_28.node_ != (NodeBase *)0x0) {
    internal::UntypedMapIterator::PlusPlus(&local_28);
  }
  (__return_storage_ptr__->second).super_UntypedMapIterator.bucket_index_ = local_28.bucket_index_;
  *(undefined4 *)&(__return_storage_ptr__->second).super_UntypedMapIterator.field_0x14 =
       local_28._20_4_;
  (__return_storage_ptr__->second).super_UntypedMapIterator.node_ = local_28.node_;
  (__return_storage_ptr__->second).super_UntypedMapIterator.m_ = local_28.m_;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, iterator> equal_range(const key_arg<K>& key)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    iterator it = find(key);
    if (it == end()) {
      return std::pair<iterator, iterator>(it, it);
    } else {
      iterator begin = it++;
      return std::pair<iterator, iterator>(begin, it);
    }
  }